

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkRenderPassCreateInfo2 * __thiscall
Fossilize::StateRecorder::Impl::copy<VkRenderPassCreateInfo2>
          (Impl *this,VkRenderPassCreateInfo2 *src,size_t count,ScratchAllocator *alloc)

{
  VkRenderPassCreateInfo2 *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkRenderPassCreateInfo2 *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkRenderPassCreateInfo2>(alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<VkRenderPassCreateInfo2_const*,VkRenderPassCreateInfo2*>
                (src,src + count,(VkRenderPassCreateInfo2 *)this_local);
    }
  }
  return (VkRenderPassCreateInfo2 *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}